

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_store_elim_pass.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::LocalSingleStoreElimPass::ProcessImpl(LocalSingleStoreElimPass *this)

{
  bool bVar1;
  IRContext *pIVar2;
  FeatureManager *this_00;
  anon_class_8_1_8991fb9c aStack_40;
  bool modified;
  undefined1 local_38 [8];
  ProcessFunction pfn;
  LocalSingleStoreElimPass *this_local;
  
  pfn._M_invoker = (_Invoker_type)this;
  pIVar2 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_feature_mgr(pIVar2);
  bVar1 = FeatureManager::HasCapability(this_00,Addresses);
  if (bVar1) {
    this_local._4_4_ = SuccessWithoutChange;
  }
  else {
    bVar1 = AllExtensionsSupported(this);
    if (bVar1) {
      aStack_40.this = this;
      std::function<bool(spvtools::opt::Function*)>::
      function<spvtools::opt::LocalSingleStoreElimPass::ProcessImpl()::__0,void>
                ((function<bool(spvtools::opt::Function*)> *)local_38,&stack0xffffffffffffffc0);
      pIVar2 = Pass::context(&this->super_Pass);
      bVar1 = IRContext::ProcessReachableCallTree(pIVar2,(ProcessFunction *)local_38);
      this_local._4_4_ = SuccessWithoutChange;
      if (bVar1) {
        this_local._4_4_ = SuccessWithChange;
      }
      std::function<bool_(spvtools::opt::Function_*)>::~function
                ((function<bool_(spvtools::opt::Function_*)> *)local_38);
    }
    else {
      this_local._4_4_ = SuccessWithoutChange;
    }
  }
  return this_local._4_4_;
}

Assistant:

Pass::Status LocalSingleStoreElimPass::ProcessImpl() {
  // Assumes relaxed logical addressing only (see instruction.h)
  if (context()->get_feature_mgr()->HasCapability(spv::Capability::Addresses))
    return Status::SuccessWithoutChange;

  // Do not process if any disallowed extensions are enabled
  if (!AllExtensionsSupported()) return Status::SuccessWithoutChange;
  // Process all entry point functions
  ProcessFunction pfn = [this](Function* fp) {
    return LocalSingleStoreElim(fp);
  };
  bool modified = context()->ProcessReachableCallTree(pfn);
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}